

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_simplify.c
# Opt level: O3

void process_statement_list(CompilerState *compiler_state,AstNodeList *list)

{
  anon_union_72_25_595a31af_for_AstNode_2 *paVar1;
  byte *pbVar2;
  LuaSymbolList **list_00;
  _Bool *p_Var3;
  AstNodeList **self;
  AstNodeList *pAVar4;
  AstNodeList *pAVar5;
  LuaSymbolList *pLVar6;
  AstNodeList *pAVar7;
  StringObject *pSVar8;
  Scope *pSVar9;
  AstNodeList *pAVar10;
  AstNodeList *pAVar11;
  LuaSymbolList *pLVar12;
  uint uVar13;
  PtrList **self_00;
  int iVar14;
  uint *puVar15;
  AstNode *pAVar16;
  Scope *pSVar17;
  StringObject *pSVar18;
  LuaSymbolList *pLVar19;
  AstNode *pAVar20;
  AstNode *pAVar21;
  AstNodeList *pAVar22;
  AstNode *pAVar23;
  CompilerState *compiler_state_00;
  char s [8];
  char f [8];
  PtrListIterator nodeiter__;
  PtrListIterator PStack_f0;
  CompilerState *pCStack_d8;
  AstNode *pAStack_d0;
  AstNode *local_c0;
  AstNode *local_b8;
  anon_union_72_25_595a31af_for_AstNode_2 *local_b0;
  PtrList **local_a8;
  AstNode *local_a0;
  AstNode *local_98;
  Scope *local_90;
  AstNode *local_88;
  AstNode *local_80;
  AstNodeList *local_78;
  undefined8 local_70;
  undefined8 local_68;
  PtrListIterator local_60;
  
  pAVar23 = (AstNode *)&stack0xffffffffffffffb8;
  pAStack_d0 = (AstNode *)0x10aeab;
  raviX_ptrlist_forward_iterator((PtrListIterator *)pAVar23,(PtrList *)list);
  pAStack_d0 = (AstNode *)0x10aeb3;
  puVar15 = (uint *)raviX_ptrlist_iter_next((PtrListIterator *)pAVar23);
joined_r0x0010aeb6:
  if (puVar15 == (uint *)0x0) {
    return;
  }
  compiler_state_00 = (CompilerState *)(ulong)*puVar15;
  switch(compiler_state_00) {
  case (CompilerState *)0x0:
  case (CompilerState *)0x2:
  case (CompilerState *)0x3:
  case (CompilerState *)0xe:
    break;
  case (CompilerState *)0x1:
    list = *(AstNodeList **)(puVar15 + 2);
    goto LAB_0010b617;
  case (CompilerState *)0x4:
    list = *(AstNodeList **)(puVar15 + 4);
    goto LAB_0010b635;
  case (CompilerState *)0x5:
    goto switchD_0010aee8_caseD_5;
  case (CompilerState *)0x6:
    list = *(AstNodeList **)(puVar15 + 8);
    goto LAB_0010b626;
  case (CompilerState *)0x7:
    list = *(AstNodeList **)(puVar15 + 2);
    pAStack_d0 = (AstNode *)0x10b5b9;
    raviX_ptrlist_forward_iterator(&local_60,(PtrList *)list);
    pAStack_d0 = (AstNode *)0x10b5c1;
    pAVar16 = (AstNode *)raviX_ptrlist_iter_next(&local_60);
    while (pAVar16 != (AstNode *)0x0) {
      pAStack_d0 = (AstNode *)0x10b5d5;
      process_expression(compiler_state,(AstNode *)(pAVar16->field_2).function_stmt.name);
      list = *(AstNodeList **)((long)&pAVar16->field_2 + 0x10);
      pAStack_d0 = (AstNode *)0x10b5e1;
      process_statement_list(compiler_state,list);
      pAStack_d0 = (AstNode *)0x10b5e9;
      pAVar16 = (AstNode *)raviX_ptrlist_iter_next(&local_60);
      pAVar23 = pAVar16;
    }
    if (*(long *)(puVar15 + 4) != 0) goto LAB_0010b5f9;
    break;
  default:
    pAStack_d0 = (AstNode *)process_expression_list;
    process_statement_list_cold_1();
    pCStack_d8 = compiler_state;
    pAStack_d0 = pAVar23;
    raviX_ptrlist_forward_iterator(&PStack_f0,(PtrList *)list);
    pAVar23 = (AstNode *)raviX_ptrlist_iter_next(&PStack_f0);
    while (pAVar23 != (AstNode *)0x0) {
      process_expression(compiler_state_00,pAVar23);
      pAVar23 = (AstNode *)raviX_ptrlist_iter_next(&PStack_f0);
    }
    return;
  case (CompilerState *)0x9:
    pAStack_d0 = (AstNode *)0x10af18;
    process_expression(compiler_state,*(AstNode **)(puVar15 + 2));
LAB_0010b5f9:
    list = *(AstNodeList **)(puVar15 + 6);
    goto LAB_0010b635;
  case (CompilerState *)0xa:
    pSVar17 = *(Scope **)(puVar15 + 2);
    pAVar23 = pSVar17->function;
    local_78 = *(AstNodeList **)(puVar15 + 8);
    pAStack_d0 = (AstNode *)0x10af65;
    local_90 = pSVar17;
    local_88 = pAVar23;
    pAVar16 = raviX_allocate_ast_node_at_line(compiler_state,STMT_DO,puVar15[1]);
    local_a8 = (PtrList **)((long)&pAVar16->field_2 + 8);
    (pAVar16->field_2).goto_stmt.name = (StringObject *)0x0;
    pAStack_d0 = (AstNode *)0x10af8b;
    local_80 = pAVar16;
    pSVar17 = raviX_allocate_scope(compiler_state,pAVar23,pSVar17->parent);
    (pAVar16->field_2).do_stmt.scope = pSVar17;
    local_60.__list._0_2_ = 0x29;
    local_68 = 0x29665f726f6628;
    local_70 = 0x29735f726f6628;
    local_60.__head = (PtrList *)0x7261765f726f6628;
    pAStack_d0 = (AstNode *)0x10afdb;
    local_b8 = raviX_allocate_ast_node_at_line(compiler_state,STMT_LOCAL,puVar15[1]);
    (local_b8->field_2).local_stmt.var_list = (LuaSymbolList *)0x0;
    paVar1 = &local_b8->field_2;
    (local_b8->field_2).goto_stmt.name = *(StringObject **)(puVar15 + 6);
    pAStack_d0 = (AstNode *)0x10b00a;
    local_b0 = paVar1;
    pSVar18 = raviX_create_string(compiler_state,(char *)&local_68,7);
    pAStack_d0 = (AstNode *)0x10b020;
    local_c0 = (AstNode *)
               raviX_new_local_symbol(compiler_state,pSVar17,pSVar18,RAVI_TANY,(StringObject *)0x0);
    pAStack_d0 = (AstNode *)0x10b037;
    pSVar18 = raviX_create_string(compiler_state,(char *)&local_70,7);
    pAStack_d0 = (AstNode *)0x10b04d;
    pAVar16 = (AstNode *)
              raviX_new_local_symbol(compiler_state,pSVar17,pSVar18,RAVI_TANY,(StringObject *)0x0);
    pAStack_d0 = (AstNode *)0x10b065;
    local_a0 = pAVar16;
    pSVar18 = raviX_create_string(compiler_state,(char *)&local_60,9);
    pAStack_d0 = (AstNode *)0x10b07b;
    local_98 = (AstNode *)
               raviX_new_local_symbol(compiler_state,pSVar17,pSVar18,RAVI_TANY,(StringObject *)0x0);
    pAVar23 = local_c0;
    pbVar2 = (byte *)((long)&local_c0->field_2 + 0x28);
    *pbVar2 = *pbVar2 | 4;
    pbVar2 = (byte *)((long)&pAVar16->field_2 + 0x28);
    *pbVar2 = *pbVar2 | 4;
    pbVar2 = (byte *)((long)&local_98->field_2 + 0x28);
    *pbVar2 = *pbVar2 | 4;
    pAStack_d0 = (AstNode *)0x10b0a0;
    raviX_add_symbol(compiler_state,(LuaSymbolList **)&paVar1->return_stmt,(LuaSymbol *)local_c0);
    list_00 = &pSVar17->symbol_list;
    pAStack_d0 = (AstNode *)0x10b0b2;
    raviX_add_symbol(compiler_state,list_00,(LuaSymbol *)pAVar23);
    paVar1 = local_b0;
    pAStack_d0 = (AstNode *)0x10b0c5;
    raviX_add_symbol(compiler_state,(LuaSymbolList **)&local_b0->return_stmt,(LuaSymbol *)pAVar16);
    pAStack_d0 = (AstNode *)0x10b0d3;
    raviX_add_symbol(compiler_state,list_00,(LuaSymbol *)pAVar16);
    pAVar23 = local_98;
    pAStack_d0 = (AstNode *)0x10b0e6;
    raviX_add_symbol(compiler_state,(LuaSymbolList **)&paVar1->return_stmt,(LuaSymbol *)local_98);
    pAStack_d0 = (AstNode *)0x10b0f4;
    raviX_add_symbol(compiler_state,list_00,(LuaSymbol *)pAVar23);
    self_00 = local_a8;
    pAStack_d0 = (AstNode *)0x10b109;
    raviX_ptrlist_add(local_a8,local_b8,compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b11b;
    pAVar23 = raviX_allocate_ast_node_at_line(compiler_state,STMT_WHILE,puVar15[1]);
    local_b8 = (AstNode *)((long)&pAVar23->field_2 + 0x10);
    local_90->parent = pSVar17;
    (pAVar23->field_2).test_then_block.test_then_scope = local_90;
    (pAVar23->field_2).goto_stmt.goto_scope = (Scope *)0x0;
    pAStack_d0 = (AstNode *)0x10b14a;
    pLVar19 = (LuaSymbolList *)raviX_allocate_ast_node_at_line(compiler_state,EXPR_LITERAL,0);
    *(byte *)&pLVar19->allocator_ = *(byte *)&pLVar19->allocator_ & 0xfe;
    *(undefined4 *)&pLVar19->prev_ = 7;
    pLVar19->next_ = (LuaSymbolList *)0x0;
    pLVar19->list_[0] = (LuaSymbol *)0x1;
    (pAVar23->field_2).local_stmt.var_list = pLVar19;
    pAStack_d0 = (AstNode *)0x10b176;
    raviX_ptrlist_add(self_00,pAVar23,compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b188;
    pAVar23 = raviX_allocate_ast_node_at_line(compiler_state,STMT_LOCAL,puVar15[1]);
    local_a8 = (PtrList **)((long)&pAVar23->field_2 + 8);
    (pAVar23->field_2).return_stmt.expr_list = *(AstNodeList **)(puVar15 + 4);
    (pAVar23->field_2).goto_stmt.name = (StringObject *)0x0;
    pAStack_d0 = (AstNode *)0x10b1ab;
    iVar14 = raviX_ptrlist_size(*(PtrList **)(puVar15 + 4));
    local_b0 = (anon_union_72_25_595a31af_for_AstNode_2 *)CONCAT44(local_b0._4_4_,iVar14);
    pAStack_d0 = (AstNode *)0x10b1be;
    pAVar16 = raviX_allocate_ast_node_at_line(compiler_state,EXPR_SUFFIXED,0);
    p_Var3 = &(pAVar16->field_2).embedded_C_stmt.is_decl;
    *p_Var3 = (_Bool)(*p_Var3 & 0xfe);
    (pAVar16->field_2).common_expr.type.type_code = RAVI_TANY;
    pAStack_d0 = (AstNode *)0x10b1de;
    pAVar20 = raviX_allocate_ast_node_at_line(compiler_state,EXPR_SYMBOL,0);
    p_Var3 = &(pAVar20->field_2).embedded_C_stmt.is_decl;
    *p_Var3 = (_Bool)(*p_Var3 & 0xfe);
    (pAVar20->field_2).common_expr.type.type_code = RAVI_TANY;
    pSVar18 = (local_c0->field_2).goto_stmt.name;
    (pAVar20->field_2).return_stmt.expr_list = (local_c0->field_2).return_stmt.expr_list;
    (pAVar20->field_2).goto_stmt.name = pSVar18;
    (pAVar20->field_2).function_stmt.function_expr = local_c0;
    (pAVar16->field_2).function_stmt.function_expr = pAVar20;
    (pAVar16->field_2).common_expr.type.type_code = RAVI_TANY;
    (pAVar16->field_2).goto_stmt.name = (StringObject *)0x0;
    (pAVar16->field_2).for_stmt.for_statement_list = (AstNodeList *)0x0;
    pAStack_d0 = (AstNode *)0x10b223;
    local_c0 = (AstNode *)((long)&pAVar16->field_2 + 0x20);
    pAVar20 = raviX_allocate_ast_node_at_line(compiler_state,EXPR_FUNCTION_CALL,0);
    p_Var3 = &(pAVar20->field_2).embedded_C_stmt.is_decl;
    *p_Var3 = (_Bool)(*p_Var3 & 0xfe);
    self = &(pAVar20->field_2).for_stmt.for_statement_list;
    (pAVar20->field_2).function_stmt.function_expr = (AstNode *)0x0;
    (pAVar20->field_2).for_stmt.for_statement_list = (AstNodeList *)0x0;
    (pAVar20->field_2).function_call_expr.num_results = (int)local_b0;
    (pAVar20->field_2).common_expr.type.type_code = RAVI_TANY;
    (pAVar20->field_2).goto_stmt.name = (StringObject *)0x0;
    pAStack_d0 = (AstNode *)0x10b25d;
    pAVar21 = raviX_allocate_ast_node_at_line(compiler_state,EXPR_SYMBOL,0);
    p_Var3 = &(pAVar21->field_2).embedded_C_stmt.is_decl;
    *p_Var3 = (_Bool)(*p_Var3 & 0xfe);
    (pAVar21->field_2).common_expr.type.type_code = RAVI_TANY;
    pSVar17 = (Scope *)(local_a0->field_2).goto_stmt.name;
    (pAVar21->field_2).return_stmt.expr_list = (local_a0->field_2).return_stmt.expr_list;
    (pAVar21->field_2).goto_stmt.name = (StringObject *)pSVar17;
    (pAVar21->field_2).function_stmt.function_expr = local_a0;
    pAStack_d0 = (AstNode *)0x10b28a;
    raviX_ptrlist_add((PtrList **)self,pAVar21,compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b299;
    pAVar21 = raviX_allocate_ast_node_at_line(compiler_state,EXPR_SYMBOL,0);
    p_Var3 = &(pAVar21->field_2).embedded_C_stmt.is_decl;
    *p_Var3 = (_Bool)(*p_Var3 & 0xfe);
    (pAVar21->field_2).common_expr.type.type_code = RAVI_TANY;
    pSVar18 = (local_98->field_2).goto_stmt.name;
    (pAVar21->field_2).return_stmt.expr_list = (local_98->field_2).return_stmt.expr_list;
    (pAVar21->field_2).goto_stmt.name = pSVar18;
    (pAVar21->field_2).function_stmt.function_expr = local_98;
    pAStack_d0 = (AstNode *)0x10b2c6;
    raviX_ptrlist_add((PtrList **)self,pAVar21,compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b2d6;
    raviX_ptrlist_add((PtrList **)local_c0,pAVar20,compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b2e6;
    raviX_ptrlist_add(local_a8,pAVar16,compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b2f6;
    raviX_ptrlist_add((PtrList **)local_b8,pAVar23,compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b300;
    pSVar17 = (Scope *)raviX_ptrlist_first(*(PtrList **)(puVar15 + 4));
    pAStack_d0 = (AstNode *)0x10b315;
    local_c0 = raviX_allocate_ast_node_at_line(compiler_state,STMT_IF,puVar15[1]);
    local_a0 = (AstNode *)&local_c0->field_2;
    (local_c0->field_2).local_stmt.var_list = (LuaSymbolList *)0x0;
    (local_c0->field_2).goto_stmt.name = (StringObject *)0x0;
    (local_c0->field_2).goto_stmt.goto_scope = (Scope *)0x0;
    pAStack_d0 = (AstNode *)0x10b344;
    pAVar23 = raviX_allocate_ast_node_at_line(compiler_state,STMT_TEST_THEN,puVar15[1]);
    pAStack_d0 = (AstNode *)0x10b356;
    pAVar22 = (AstNodeList *)raviX_allocate_ast_node_at_line(compiler_state,EXPR_BINARY,0);
    *(byte *)&pAVar22->allocator_ = *(byte *)&pAVar22->allocator_ & 0xfe;
    *(undefined4 *)&pAVar22->prev_ = 0xffffffff;
    pAStack_d0 = (AstNode *)0x10b376;
    pAVar16 = raviX_allocate_ast_node_at_line(compiler_state,EXPR_SYMBOL,0);
    p_Var3 = &(pAVar16->field_2).embedded_C_stmt.is_decl;
    *p_Var3 = (_Bool)(*p_Var3 & 0xfe);
    (pAVar16->field_2).common_expr.type.type_code = RAVI_TANY;
    pLVar19 = pSVar17->symbol_list;
    (pAVar16->field_2).return_stmt.expr_list = (AstNodeList *)pSVar17->parent;
    (pAVar16->field_2).goto_stmt.name = (StringObject *)pLVar19;
    (pAVar16->field_2).for_stmt.for_body = pSVar17;
    pAVar22->list_[0] = pAVar16;
    pAStack_d0 = (AstNode *)0x10b39f;
    pAVar16 = raviX_allocate_ast_node_at_line(compiler_state,EXPR_LITERAL,0);
    p_Var3 = &(pAVar16->field_2).embedded_C_stmt.is_decl;
    *p_Var3 = (_Bool)(*p_Var3 & 0xfe);
    (pAVar16->field_2).common_expr.type.type_code = RAVI_TNIL;
    (pAVar16->field_2).goto_stmt.name = (StringObject *)0x0;
    (pAVar16->field_2).function_stmt.function_expr = (AstNode *)0x0;
    pAVar22->list_[1] = pAVar16;
    *(undefined4 *)((long)&pAVar22->allocator_ + 4) = 0xd;
    (pAVar23->field_2).expression_stmt.var_expr_list = pAVar22;
    (pAVar23->field_2).goto_stmt.name = (StringObject *)0x0;
    (pAVar23->field_2).goto_stmt.goto_scope = (Scope *)0x0;
    pAStack_d0 = (AstNode *)0x10b3e4;
    pSVar17 = raviX_allocate_scope(compiler_state,local_88,local_90);
    (pAVar23->field_2).test_then_block.test_then_scope = pSVar17;
    pAStack_d0 = (AstNode *)0x10b3ff;
    pSVar18 = raviX_create_string(compiler_state,"break",6);
    pAStack_d0 = (AstNode *)0x10b411;
    pAVar16 = raviX_allocate_ast_node_at_line(compiler_state,STMT_GOTO,0);
    (pAVar16->field_2).goto_stmt.name = pSVar18;
    *(byte *)&pAVar16->field_2 = *(byte *)&pAVar16->field_2 | 1;
    (pAVar16->field_2).goto_stmt.goto_scope = pSVar17;
    pAStack_d0 = (AstNode *)0x10b42b;
    raviX_ptrlist_add((PtrList **)&(pAVar23->field_2).goto_stmt.goto_scope,pAVar16,
                      compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b43b;
    raviX_ptrlist_add((PtrList **)local_a0,pAVar23,compiler_state->allocator);
    pAVar16 = local_b8;
    pAStack_d0 = (AstNode *)0x10b450;
    raviX_ptrlist_add((PtrList **)local_b8,local_c0,compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b462;
    pAVar23 = raviX_allocate_ast_node_at_line(compiler_state,STMT_EXPR,puVar15[1]);
    (pAVar23->field_2).local_stmt.var_list = (LuaSymbolList *)0x0;
    (pAVar23->field_2).goto_stmt.name = (StringObject *)0x0;
    pAStack_d0 = (AstNode *)0x10b485;
    pAVar20 = raviX_allocate_ast_node_at_line(compiler_state,EXPR_SYMBOL,0);
    p_Var3 = &(pAVar20->field_2).embedded_C_stmt.is_decl;
    *p_Var3 = (_Bool)(*p_Var3 & 0xfe);
    (pAVar20->field_2).common_expr.type.type_code = RAVI_TANY;
    pSVar18 = (local_98->field_2).goto_stmt.name;
    (pAVar20->field_2).return_stmt.expr_list = (local_98->field_2).return_stmt.expr_list;
    (pAVar20->field_2).goto_stmt.name = pSVar18;
    (pAVar20->field_2).function_stmt.function_expr = local_98;
    pAStack_d0 = (AstNode *)0x10b4b2;
    raviX_ptrlist_add((PtrList **)&(pAVar23->field_2).return_stmt,pAVar20,compiler_state->allocator)
    ;
    pAStack_d0 = (AstNode *)0x10b4bc;
    pSVar17 = (Scope *)raviX_ptrlist_first(*(PtrList **)(puVar15 + 4));
    pAStack_d0 = (AstNode *)0x10b4ce;
    pAVar20 = raviX_allocate_ast_node_at_line(compiler_state,EXPR_SYMBOL,0);
    p_Var3 = &(pAVar20->field_2).embedded_C_stmt.is_decl;
    *p_Var3 = (_Bool)(*p_Var3 & 0xfe);
    (pAVar20->field_2).common_expr.type.type_code = RAVI_TANY;
    pLVar19 = pSVar17->symbol_list;
    (pAVar20->field_2).return_stmt.expr_list = (AstNodeList *)pSVar17->parent;
    (pAVar20->field_2).goto_stmt.name = (StringObject *)pLVar19;
    (pAVar20->field_2).for_stmt.for_body = pSVar17;
    pAStack_d0 = (AstNode *)0x10b4f7;
    raviX_ptrlist_add((PtrList **)&(pAVar23->field_2).goto_stmt.name,pAVar20,
                      compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b505;
    raviX_ptrlist_add((PtrList **)pAVar16,pAVar23,compiler_state->allocator);
    pAStack_d0 = (AstNode *)0x10b517;
    pAVar23 = raviX_allocate_ast_node_at_line(compiler_state,STMT_DO,puVar15[1]);
    (pAVar23->field_2).goto_stmt.name = (StringObject *)0x0;
    (pAVar23->field_2).return_stmt.expr_list = local_78;
    pAStack_d0 = (AstNode *)0x10b538;
    raviX_ptrlist_add((PtrList **)pAVar16,pAVar23,compiler_state->allocator);
    (pAVar23->field_2).goto_stmt.name = *(StringObject **)(puVar15 + 10);
    puVar15[2] = 0;
    puVar15[3] = 0;
    puVar15[8] = 0;
    puVar15[9] = 0;
    puVar15[10] = 0;
    puVar15[0xb] = 0;
    uVar13 = local_80->line_number;
    pAVar7 = (local_80->field_2).return_stmt.expr_list;
    pSVar8 = (local_80->field_2).goto_stmt.name;
    pSVar9 = (local_80->field_2).goto_stmt.goto_scope;
    pAVar20 = (local_80->field_2).function_stmt.function_expr;
    pAVar10 = (local_80->field_2).for_stmt.for_statement_list;
    pAVar11 = (local_80->field_2).function_expr.function_statement_list;
    pLVar12 = (local_80->field_2).function_expr.args;
    pSVar18 = (local_80->field_2).goto_stmt.name;
    pSVar17 = (local_80->field_2).goto_stmt.goto_scope;
    pAVar16 = (local_80->field_2).function_stmt.function_expr;
    pAVar22 = (local_80->field_2).for_stmt.for_statement_list;
    pAVar4 = (local_80->field_2).function_expr.function_statement_list;
    pLVar19 = (local_80->field_2).function_expr.args;
    pAVar5 = (local_80->field_2).function_expr.child_functions;
    pLVar6 = (local_80->field_2).function_expr.upvalues;
    puVar15[0] = local_80->type;
    puVar15[1] = uVar13;
    *(AstNodeList **)(puVar15 + 2) = pAVar7;
    *(StringObject **)(puVar15 + 4) = pSVar8;
    *(Scope **)(puVar15 + 6) = pSVar9;
    *(AstNode **)(puVar15 + 8) = pAVar20;
    *(AstNodeList **)(puVar15 + 10) = pAVar10;
    *(AstNodeList **)(puVar15 + 0xc) = pAVar11;
    *(LuaSymbolList **)(puVar15 + 0xe) = pLVar12;
    *(StringObject **)(puVar15 + 4) = pSVar18;
    *(Scope **)(puVar15 + 6) = pSVar17;
    *(AstNode **)(puVar15 + 8) = pAVar16;
    *(AstNodeList **)(puVar15 + 10) = pAVar22;
    *(AstNodeList **)(puVar15 + 0xc) = pAVar4;
    *(LuaSymbolList **)(puVar15 + 0xe) = pLVar19;
    *(AstNodeList **)(puVar15 + 0x10) = pAVar5;
    *(LuaSymbolList **)(puVar15 + 0x12) = pLVar6;
    if (*puVar15 != 4) {
      pAStack_d0 = (AstNode *)0x10b685;
      __assert_fail("node->type == STMT_DO",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_lower.c"
                    ,400,"void process_statement(CompilerState *, AstNode *)");
    }
    list = *(AstNodeList **)(puVar15 + 4);
    pAStack_d0 = (AstNode *)0x10b593;
    process_statement_list(compiler_state,list);
    break;
  case (CompilerState *)0xb:
    pAStack_d0 = (AstNode *)0x10af01;
    process_expression_list(compiler_state,*(AstNodeList **)(puVar15 + 6));
    list = *(AstNodeList **)(puVar15 + 10);
LAB_0010b635:
    pAStack_d0 = (AstNode *)0x10b63d;
    process_statement_list(compiler_state,list);
    break;
  case (CompilerState *)0xc:
    pAStack_d0 = (AstNode *)0x10af2a;
    process_statement_list(compiler_state,*(AstNodeList **)(puVar15 + 6));
    list = *(AstNodeList **)(puVar15 + 2);
LAB_0010b626:
    pAStack_d0 = (AstNode *)0x10b62e;
    process_expression(compiler_state,(AstNode *)list);
    break;
  case (CompilerState *)0xd:
    if (*(AstNodeList **)(puVar15 + 2) != (AstNodeList *)0x0) {
      pAStack_d0 = (AstNode *)0x10b612;
      process_expression_list(compiler_state,*(AstNodeList **)(puVar15 + 2));
    }
    goto switchD_0010aee8_caseD_5;
  }
switchD_0010aee8_caseD_0:
  pAStack_d0 = (AstNode *)0x10b645;
  puVar15 = (uint *)raviX_ptrlist_iter_next((PtrListIterator *)&stack0xffffffffffffffb8);
  goto joined_r0x0010aeb6;
switchD_0010aee8_caseD_5:
  list = *(AstNodeList **)(puVar15 + 4);
LAB_0010b617:
  pAStack_d0 = (AstNode *)0x10b61f;
  process_expression_list(compiler_state,list);
  goto switchD_0010aee8_caseD_0;
}

Assistant:

static void process_statement_list(CompilerState *compiler_state, AstNodeList *list)
{
	AstNode *node;
	FOR_EACH_PTR(list, AstNode, node) { process_statement(compiler_state, node); }
	END_FOR_EACH_PTR(node);
}